

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O0

void __thiscall POSG::SetNrAgents(POSG *this,size_t nrAgents)

{
  pointer in_RSI;
  vector<Globals::reward_t,_std::allocator<Globals::reward_t>_> *in_RDI;
  allocator_type *in_stack_ffffffffffffff78;
  allocator_type *__a;
  vector<Globals::reward_t,_std::allocator<Globals::reward_t>_> *this_00;
  undefined1 *__n;
  allocator_type local_65;
  undefined4 local_64;
  undefined1 local_31;
  undefined8 local_30;
  
  if (((ulong)(((_Vector_base<double,_std::allocator<double>_> *)
               &in_RDI->super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>)->
              _M_impl).super__Vector_impl_data._M_finish & 1) != 0) {
    *(undefined1 *)
     &(((_Vector_base<double,_std::allocator<double>_> *)
       &in_RDI->super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>)->_M_impl)
      .super__Vector_impl_data._M_finish = 0;
    (((_Vector_base<double,_std::allocator<double>_> *)
     &in_RDI->super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>)->_M_impl).
    super__Vector_impl_data._M_end_of_storage = in_RSI;
  }
  this_00 = (vector<Globals::reward_t,_std::allocator<Globals::reward_t>_> *)
            (((_Vector_base<double,_std::allocator<double>_> *)
             &in_RDI->super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>)->
            _M_impl).super__Vector_impl_data._M_end_of_storage;
  local_30 = 0x3ff0000000000000;
  __n = &local_31;
  std::allocator<double>::allocator((allocator<double> *)0xadb0db);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_RDI,(size_type)__n,
             (value_type_conflict3 *)this_00,in_stack_ffffffffffffff78);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)this_00,
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff78);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  std::allocator<double>::~allocator((allocator<double> *)0xadb120);
  local_64 = 0;
  __a = &local_65;
  std::allocator<Globals::reward_t>::allocator((allocator<Globals::reward_t> *)0xadb145);
  std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>::vector
            (in_RDI,(size_type)__n,(value_type *)this_00,__a);
  std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>::operator=
            (this_00,(vector<Globals::reward_t,_std::allocator<Globals::reward_t>_> *)__a);
  std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>::~vector(this_00);
  std::allocator<Globals::reward_t>::~allocator((allocator<Globals::reward_t> *)0xadb187);
  return;
}

Assistant:

void POSG::SetNrAgents (size_t nrAgents)
{
    if(_m_initialized)
    {
        //do some de-initialization things ?
        _m_initialized = false;
        _m_nrAgents = nrAgents;
    }    

    _m_discount = vector<double>(_m_nrAgents, 1.0);
    _m_rewardType = vector<reward_t>(_m_nrAgents, REWARD);

}